

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-test.cpp
# Opt level: O0

FileInfoWrapper<ASDCP::MPEG2::MXFReader,_MyVideoDescriptor> * __thiscall
FileInfoWrapper<ASDCP::MPEG2::MXFReader,_MyVideoDescriptor>::file_info
          (FileInfoWrapper<ASDCP::MPEG2::MXFReader,_MyVideoDescriptor> *this,CommandOptions *Options
          ,char *type_string,IFileReaderFactory *fileReaderFactory,FILE *stream)

{
  char *__s;
  bool bVar1;
  int iVar2;
  undefined1 local_244 [8];
  MyVideoDescriptor Desc;
  undefined1 local_198 [8];
  WriterInfo WI;
  string local_e0 [32];
  string local_c0 [120];
  undefined1 local_48 [8];
  MXFReader Reader;
  FILE *local_30;
  FILE *stream_local;
  IFileReaderFactory *fileReaderFactory_local;
  char *type_string_local;
  CommandOptions *Options_local;
  Result_t *result;
  
  if (type_string == (char *)0x0) {
    __assert_fail("type_string",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/asdcp-test.cpp"
                  ,0x6f0,
                  "static Result_t FileInfoWrapper<ASDCP::MPEG2::MXFReader, MyVideoDescriptor>::file_info(CommandOptions &, const char *, const Kumu::IFileReaderFactory &, FILE *) [ReaderT = ASDCP::MPEG2::MXFReader, DescriptorT = MyVideoDescriptor]"
                 );
  }
  local_30 = (FILE *)stream;
  if (stream == (FILE *)0x0) {
    local_30 = _stdout;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  if (((Options->verbose_flag & 1U) != 0) || ((Options->showheader_flag & 1U) != 0)) {
    ASDCP::MPEG2::MXFReader::MXFReader((MXFReader *)local_48,fileReaderFactory);
    __s = Options->filenames[0];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_e0,__s,(allocator<char> *)&WI.field_0xaf);
    ASDCP::MPEG2::MXFReader::OpenRead(local_c0);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_c0);
    Kumu::Result_t::~Result_t((Result_t *)local_c0);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&WI.field_0xaf);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (iVar2 < 0) {
      bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
      if ((bVar1) && ((Options->showheader_flag & 1U) != 0)) {
        ASDCP::MPEG2::MXFReader::DumpHeaderMetadata((_IO_FILE *)local_48);
      }
    }
    else {
      fprintf(_stdout,"File essence type is %s.\n",type_string);
      if ((Options->showheader_flag & 1U) != 0) {
        ASDCP::MPEG2::MXFReader::DumpHeaderMetadata((_IO_FILE *)local_48);
      }
      ASDCP::WriterInfo::WriterInfo((WriterInfo *)local_198);
      ASDCP::MPEG2::MXFReader::FillWriterInfo
                ((WriterInfo *)&Desc.super_VideoDescriptor.ProfileAndLevel);
      Kumu::Result_t::~Result_t((Result_t *)&Desc.super_VideoDescriptor.ProfileAndLevel);
      ASDCP::WriterInfoDump((WriterInfo *)local_198,local_30);
      MyVideoDescriptor::MyVideoDescriptor((MyVideoDescriptor *)local_244);
      MyVideoDescriptor::FillDescriptor((MyVideoDescriptor *)local_244,(MXFReader *)local_48);
      MyVideoDescriptor::Dump((MyVideoDescriptor *)local_244,(FILE *)local_30);
      if ((Options->showindex_flag & 1U) != 0) {
        ASDCP::MPEG2::MXFReader::DumpIndex((_IO_FILE *)local_48);
      }
      ASDCP::WriterInfo::~WriterInfo((WriterInfo *)local_198);
    }
    ASDCP::MPEG2::MXFReader::~MXFReader((MXFReader *)local_48);
  }
  return this;
}

Assistant:

static Result_t
  file_info(CommandOptions& Options, const char* type_string, const Kumu::IFileReaderFactory& fileReaderFactory, FILE* stream = 0)
  {
    assert(type_string);
    if ( stream == 0 )
      stream = stdout;

    Result_t result = RESULT_OK;

    if ( Options.verbose_flag || Options.showheader_flag )
      {
	ReaderT     Reader(fileReaderFactory);
	result = Reader.OpenRead(Options.filenames[0]);

	if ( ASDCP_SUCCESS(result) )
	  {
	    fprintf(stdout, "File essence type is %s.\n", type_string);

	    if ( Options.showheader_flag )
	      Reader.DumpHeaderMetadata(stream);

	    WriterInfo WI;
	    Reader.FillWriterInfo(WI);
	    WriterInfoDump(WI, stream);

	    DescriptorT Desc;
	    Desc.FillDescriptor(Reader);
	    Desc.Dump(stream);

	    if ( Options.showindex_flag )
	      Reader.DumpIndex(stream);
	  }
	else if ( result == RESULT_FORMAT && Options.showheader_flag )
	  {
	    Reader.DumpHeaderMetadata(stream);
	  }
      }

    return result;
  }